

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.cpp
# Opt level: O2

int duckdb_lz4::LZ4_setStreamDecode
              (LZ4_streamDecode_t *LZ4_streamDecode,char *dictionary,int dictSize)

{
  (LZ4_streamDecode->internal_donotuse).prefixSize = (long)dictSize;
  (LZ4_streamDecode->internal_donotuse).prefixEnd = (LZ4_byte *)(dictionary + dictSize);
  (LZ4_streamDecode->internal_donotuse).externalDict = (LZ4_byte *)0x0;
  (LZ4_streamDecode->internal_donotuse).extDictSize = 0;
  return 1;
}

Assistant:

int LZ4_setStreamDecode (LZ4_streamDecode_t* LZ4_streamDecode, const char* dictionary, int dictSize)
{
    LZ4_streamDecode_t_internal* lz4sd = &LZ4_streamDecode->internal_donotuse;
    lz4sd->prefixSize = (size_t)dictSize;
    if (dictSize) {
        assert(dictionary != NULL);
        lz4sd->prefixEnd = (const BYTE*) dictionary + dictSize;
    } else {
        lz4sd->prefixEnd = (const BYTE*) dictionary;
    }
    lz4sd->externalDict = NULL;
    lz4sd->extDictSize  = 0;
    return 1;
}